

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_quality.hpp
# Opt level: O0

void __thiscall
Omega_h::MetricElementQualities<2,_2>::~MetricElementQualities(MetricElementQualities<2,_2> *this)

{
  MetricElementQualities<3,_3> *this_local;
  
  Read<double>::~Read(&this->metrics);
  Read<double>::~Read(&this->coords);
  return;
}

Assistant:

MetricElementQualities(Mesh const* mesh, Reals metrics_in)
      : coords(mesh->coords()), metrics(metrics_in) {}